

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O0

void init_ld_script(GlobalVars *gv)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  GlobalVars *in_RDI;
  uint8_t unaff_retaddr;
  char *in_stack_00000008;
  GlobalVars *in_stack_00000010;
  char *keyword;
  bool secdef;
  char c;
  GlobalVars *in_stack_000000b0;
  GlobalVars *in_stack_000000d0;
  GlobalVars *in_stack_00000100;
  GlobalVars *in_stack_00000130;
  lword in_stack_ffffffffffffffb0;
  MemoryDescr *in_stack_ffffffffffffffb8;
  MemoryDescr *in_stack_ffffffffffffffc0;
  GlobalVars *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  GlobalVars *in_stack_ffffffffffffffd8;
  char *local_20;
  int iVar5;
  undefined4 in_stack_fffffffffffffff4;
  
  if (in_RDI->dest_object == 0) {
    if (in_RDI->ldscript == (char *)0x0) {
      local_20 = fff[in_RDI->dest_format]->exeldscript;
    }
    else {
      local_20 = in_RDI->ldscript;
    }
    scriptbase = local_20;
  }
  else if (in_RDI->dest_sharedobj != 0) {
    if (in_RDI->ldscript == (char *)0x0) {
      scriptbase = fff[in_RDI->dest_format]->soldscript;
      in_stack_ffffffffffffffd8 = (GlobalVars *)scriptbase;
    }
    else {
      scriptbase = in_RDI->ldscript;
      in_stack_ffffffffffffffd8 = (GlobalVars *)scriptbase;
    }
  }
  if (scriptbase != (char *)0x0) {
    iVar5 = 0;
    preparse = 1;
    current_ls = (LinkedSection *)0x0;
    level = 0;
    defmem = add_memblock((char *)in_stack_ffffffffffffffc0,(lword)in_stack_ffffffffffffffb8,
                          in_stack_ffffffffffffffb0);
    vdefmem = defmem;
    ldefmem = defmem;
    atdefmem = add_memblock((char *)in_stack_ffffffffffffffc0,(lword)in_stack_ffffffffffffffb8,
                            in_stack_ffffffffffffffb0);
    change_address(in_stack_ffffffffffffffc0,(lword)in_stack_ffffffffffffffb8);
    scriptname = in_RDI->scriptname;
    if (scriptname == (char *)0x0) {
      scriptname = "built-in script";
    }
    script_obj = make_ld_objunit(in_stack_000000b0);
    init_parser(in_RDI,scriptname,scriptbase,1);
    do {
      while (pcVar4 = getword(), pcVar4 != (char *)0x0) {
        iVar2 = strcmp(pcVar4,"MEMORY");
        if (iVar2 == 0) {
          in_RDI->use_ldscript = 1;
          if (iVar5 == 0) {
            define_memory(in_stack_000000d0);
          }
          else {
            in_stack_ffffffffffffffd0 = scriptname;
            uVar3 = getlineno();
            error(100,in_stack_ffffffffffffffd0,(ulong)uVar3,pcVar4);
            skipblock(0,'\0','\x11');
          }
        }
        else {
          iVar2 = strcmp(pcVar4,"PHDRS");
          if (iVar2 == 0) {
            in_RDI->use_ldscript = 1;
            if (iVar5 == 0) {
              define_phdrs(in_stack_00000100);
            }
            else {
              in_stack_ffffffffffffffc8 = (GlobalVars *)scriptname;
              uVar3 = getlineno();
              error(100,in_stack_ffffffffffffffc8,(ulong)uVar3,pcVar4);
              skipblock(0,'\0','\x11');
            }
          }
          else {
            iVar2 = strcmp(pcVar4,"SECTIONS");
            if (iVar2 == 0) {
              in_RDI->use_ldscript = 1;
              if (iVar5 == 0) {
                iVar5 = 1;
              }
              else {
                in_stack_ffffffffffffffc0 = (MemoryDescr *)scriptname;
                uVar3 = getlineno();
                error(0x4a,in_stack_ffffffffffffffc0,(ulong)uVar3);
              }
              if (in_RDI->phdrlist == (Phdr *)0x0) {
                add_phdr(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                         (uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                         (uint16_t)((ulong)in_stack_ffffffffffffffc8 >> 0x10),
                         (lword)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                         (MemoryDescr *)CONCAT44(in_stack_fffffffffffffff4,iVar5));
                add_phdr(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                         (uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                         (uint16_t)((ulong)in_stack_ffffffffffffffc8 >> 0x10),
                         (lword)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                         (MemoryDescr *)CONCAT44(in_stack_fffffffffffffff4,iVar5));
              }
              level = 1;
              predefine_sections(in_stack_00000130);
              level = 0;
            }
            else {
              iVar2 = check_command(in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                                    (uint32_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
              if (iVar2 == 0) {
                cVar1 = getchr();
                if (cVar1 == '=') {
                  symbol_assignment(in_stack_00000010,in_stack_00000008,unaff_retaddr);
                }
                else {
                  in_stack_ffffffffffffffb8 = (MemoryDescr *)scriptname;
                  uVar3 = getlineno();
                  error(0x41,in_stack_ffffffffffffffb8,(ulong)uVar3,pcVar4);
                  back(1);
                }
              }
            }
          }
        }
      }
      cVar1 = getchr();
      in_stack_fffffffffffffff4 = CONCAT13(cVar1,(int3)in_stack_fffffffffffffff4);
    } while (cVar1 == ';');
    if (cVar1 != '\0') {
      back(1);
      pcVar4 = scriptname;
      uVar3 = getlineno();
      error(0x4e,pcVar4,(ulong)uVar3);
    }
    preparse = 0;
  }
  return;
}

Assistant:

void init_ld_script(struct GlobalVars *gv)
{
  char c;

  if (!gv->dest_object) {
    scriptbase = gv->ldscript ? gv->ldscript :
                                fff[gv->dest_format]->exeldscript;
  }
  else if (gv->dest_sharedobj) {
    scriptbase = gv->ldscript ? gv->ldscript :
                                fff[gv->dest_format]->soldscript;
  }

  if (scriptbase) {
    bool secdef = FALSE;
    char *keyword;

    /* initialization */
    preparse = TRUE;
    current_ls = NULL;
    level = 0; /* outside SECTIONS block */
    defmem = vdefmem = ldefmem = add_memblock(defmemname,MEM_DEFORG,MEM_DEFLEN);
    atdefmem = add_memblock("lmadefault",MEM_DEFORG,MEM_DEFLEN);
    change_address(defmem,gv->start_addr);
    if (!(scriptname = gv->scriptname))
      scriptname = "built-in script";
    script_obj = make_ld_objunit(gv);

    /* pre-parse script: get memory-regions and symbol definitions */
    init_parser(gv,scriptname,scriptbase,1);

    do {
      while (keyword = getword()) {

        if (!strcmp(keyword,"MEMORY")) {
          gv->use_ldscript = TRUE;
          if (secdef == FALSE) {
            define_memory(gv);
          }
          else {
            /* MEMORY behind SECTIONS ignored */
            error(100,scriptname,getlineno(),keyword);
            skipblock(0,'{','}');
          }
        }

        else if (!strcmp(keyword,"PHDRS")) {
          gv->use_ldscript = TRUE;
          if (secdef == FALSE) {
            define_phdrs(gv);
          }
          else {
            /* PHDRS behind SECTIONS ignored */
            error(100,scriptname,getlineno(),keyword);
            skipblock(0,'{','}');
          }
        }

        else if (!strcmp(keyword,"SECTIONS")) {
          gv->use_ldscript = TRUE;
          if (secdef)
            error(74,scriptname,getlineno());  /* SECTIONS block def. twice */
          else
            secdef = TRUE;

          /* Define default PHDRs */
          if (gv->phdrlist == NULL) {
            add_phdr(gv,deftxt,PT_LOAD,PHDR_FLAGS|PF_X|PF_R,
                     ADDR_NONE,defmem,defmem);
            add_phdr(gv,defdat,PT_LOAD,PHDR_FLAGS|PF_R|PF_W,
                     ADDR_NONE,defmem,defmem);
          }
          level = 1;
          predefine_sections(gv);
          level = 0;
        }

        else {
          if (check_command(gv,keyword,SCMDF_GLOBAL)) {
            /* script-command executed */
            continue;
          }

          else if (getchr() == '=') {
            /* symbol assignment */
            symbol_assignment(gv,keyword,0);
          }

          else {
            /* unknown keyword ignored */
            error(65,scriptname,getlineno(),keyword);
            back(1);
          }
        }
      }
    }
    while ((c = getchr()) == ';');

    if (c) {
      back(1);
      error(78,scriptname,getlineno());   /* missing argument */
    }
    preparse = FALSE;
  }
}